

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall
DynamicGraph::rollBack
          (DynamicGraph *this,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  pointer puVar1;
  _List_node_base *p_Var2;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  *__range1;
  
  p_Var2 = (_List_node_base *)actions;
  while (p_Var2 = (((_List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)actions) {
    (*(code *)**(undefined8 **)p_Var2[1]._M_next)();
  }
  while (p_Var2 = (incVertices->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)incVertices) {
    p_Var2 = p_Var2[1]._M_next;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(incVertices);
    puVar1 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start + (long)p_Var2;
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

void DynamicGraph::rollBack(std::list<std::unique_ptr<Action>> &actions, std::list<Vertex>& incVertices)
{
    for (auto &action : actions) {
        (*action).undo();
    }

    while(!incVertices.empty()) {
        Vertex v = incVertices.front();
        incVertices.pop_front();
        this->level[v]--;
    }
}